

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_neon_subl(TCGContext_conflict1 *tcg_ctx,int size)

{
  int size_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (size == 0) {
    gen_helper_neon_subl_u16(tcg_ctx,tcg_ctx->cpu_V0,tcg_ctx->cpu_V0,tcg_ctx->cpu_V1);
  }
  else if (size == 1) {
    gen_helper_neon_subl_u32(tcg_ctx,tcg_ctx->cpu_V0,tcg_ctx->cpu_V0,tcg_ctx->cpu_V1);
  }
  else {
    if (size != 2) {
      abort();
    }
    tcg_gen_sub_i64(tcg_ctx,tcg_ctx->cpu_V0,tcg_ctx->cpu_V0,tcg_ctx->cpu_V1);
  }
  return;
}

Assistant:

static inline void gen_neon_subl(TCGContext *tcg_ctx, int size)
{
    switch (size) {
    case 0: gen_helper_neon_subl_u16(tcg_ctx, CPU_V001); break;
    case 1: gen_helper_neon_subl_u32(tcg_ctx, CPU_V001); break;
    case 2: tcg_gen_sub_i64(tcg_ctx, CPU_V001); break;
    default: abort();
    }
}